

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclCnRunner.cpp
# Opt level: O1

int __thiscall xmrig::OclCnRunner::init(OclCnRunner *this,EVP_PKEY_CTX *ctx)

{
  cl_mem p_Var1;
  size_t i;
  long lVar2;
  
  OclBaseRunner::init(&this->super_OclBaseRunner,ctx);
  p_Var1 = OclBaseRunner::createSubBuffer
                     (&this->super_OclBaseRunner,1,
                      (ulong)(this->super_OclBaseRunner).m_intensity << 0x14);
  this->m_scratchpads = p_Var1;
  p_Var1 = OclBaseRunner::createSubBuffer
                     (&this->super_OclBaseRunner,1,
                      (ulong)((this->super_OclBaseRunner).m_intensity * 200));
  this->m_states = p_Var1;
  lVar2 = 0;
  do {
    p_Var1 = OclBaseRunner::createSubBuffer
                       (&this->super_OclBaseRunner,1,
                        (ulong)((this->super_OclBaseRunner).m_intensity + 2) << 2);
    (this->m_branches).super__Vector_base<_cl_mem_*,_std::allocator<_cl_mem_*>_>._M_impl.
    super__Vector_impl_data._M_start[lVar2] = p_Var1;
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  return (int)p_Var1;
}

Assistant:

void xmrig::OclCnRunner::init()
{
    OclBaseRunner::init();

    m_scratchpads = createSubBuffer(CL_MEM_READ_WRITE, CnAlgo::CN_MEMORY * m_intensity);
    m_states      = createSubBuffer(CL_MEM_READ_WRITE, 200 * m_intensity);

    for (size_t i = 0; i < BRANCH_MAX; ++i) {
        m_branches[i] = createSubBuffer(CL_MEM_READ_WRITE, sizeof(cl_uint) * (m_intensity + 2));
    }
}